

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void llvm::APInt::tcSetLeastSignificantBits(WordType *dst,uint parts,uint bits)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (0x40 < bits) {
    uVar3 = bits - 0x41 >> 6;
    memset(dst,0xff,(ulong)(uVar3 * 8 + 8));
    lVar1 = 0;
    do {
      lVar1 = lVar1 + 0x40;
    } while ((ulong)(bits - 0x41 & 0xffffffc0) + 0x40 != lVar1);
    uVar3 = uVar3 + 1;
    bits = bits - (int)lVar1;
  }
  if (bits != 0) {
    uVar2 = (ulong)uVar3;
    uVar3 = uVar3 + 1;
    dst[uVar2] = 0xffffffffffffffff >> (-(char)bits & 0x3fU);
  }
  if (uVar3 < parts) {
    memset(dst + uVar3,0,(ulong)(~uVar3 + parts) * 8 + 8);
    return;
  }
  return;
}

Assistant:

void APInt::tcSetLeastSignificantBits(WordType *dst, unsigned parts,
                                      unsigned bits) {
  unsigned i = 0;
  while (bits > APINT_BITS_PER_WORD) {
    dst[i++] = ~(WordType) 0;
    bits -= APINT_BITS_PER_WORD;
  }

  if (bits)
    dst[i++] = ~(WordType) 0 >> (APINT_BITS_PER_WORD - bits);

  while (i < parts)
    dst[i++] = 0;
}